

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O1

void pdqsort_detail::
     pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCliqueTable::extractCliquesFromCut(HighsMipSolver_const&,int_const*,double_const*,int,double)::__1,false>
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,
               anon_class_8_1_8992ca70 comp,int bad_allowed,bool leftmost)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  double *pdVar4;
  int *piVar5;
  ulong uVar6;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var7;
  _DistanceType __len;
  ulong uVar8;
  long lVar9;
  int *piVar10;
  int *piVar11;
  ulong uVar12;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var13;
  int *piVar14;
  long lVar15;
  int *piVar16;
  T tmp_1;
  long lVar17;
  bool bVar18;
  double dVar19;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:1213:36)>
  __cmp;
  
  piVar1 = end._M_current + -1;
  do {
    lVar17 = (long)end._M_current - (long)begin._M_current;
    uVar8 = lVar17 >> 2;
    if ((long)uVar8 < 0x18) {
      if ((leftmost & 1U) == 0) {
        if ((begin._M_current != end._M_current) && (begin._M_current + 1 != end._M_current)) {
          pdVar4 = *comp.vals;
          _Var7._M_current = begin._M_current;
          piVar14 = begin._M_current + 1;
          do {
            iVar2 = _Var7._M_current[1];
            dVar19 = ABS(pdVar4[iVar2]);
            if ((ABS(pdVar4[*_Var7._M_current]) < dVar19) ||
               ((*_Var7._M_current < iVar2 && (ABS(pdVar4[*_Var7._M_current]) <= dVar19)))) {
              do {
                do {
                  piVar10 = _Var7._M_current;
                  piVar10[1] = *piVar10;
                  _Var7._M_current = piVar10 + -1;
                } while (ABS(pdVar4[piVar10[-1]]) < dVar19);
              } while ((piVar10[-1] < iVar2) && (ABS(pdVar4[piVar10[-1]]) <= dVar19));
              *piVar10 = iVar2;
            }
            piVar10 = piVar14 + 1;
            _Var7._M_current = piVar14;
            piVar14 = piVar10;
          } while (piVar10 != end._M_current);
        }
      }
      else if ((begin._M_current != end._M_current) &&
              (piVar14 = begin._M_current + 1, piVar14 != end._M_current)) {
        pdVar4 = *comp.vals;
        lVar17 = 0;
        _Var7._M_current = begin._M_current;
        do {
          iVar2 = *piVar14;
          iVar3 = *_Var7._M_current;
          dVar19 = ABS(pdVar4[iVar2]);
          if ((ABS(pdVar4[iVar3]) < dVar19) || ((iVar3 < iVar2 && (ABS(pdVar4[iVar3]) <= dVar19))))
          {
            piVar10 = piVar14 + -1;
            *piVar14 = iVar3;
            if (piVar10 != begin._M_current) {
              lVar9 = 0;
              do {
                iVar3 = *(_Var7._M_current + lVar9 + -4);
                if ((dVar19 <= ABS(pdVar4[iVar3])) &&
                   ((iVar2 <= iVar3 || (dVar19 < ABS(pdVar4[iVar3]))))) break;
                *(_Var7._M_current + lVar9) = iVar3;
                lVar9 = lVar9 + -4;
              } while (lVar17 != lVar9);
              piVar10 = lVar9 + _Var7._M_current;
            }
            *piVar10 = iVar2;
          }
          piVar14 = piVar14 + 1;
          _Var7._M_current = _Var7._M_current + 1;
          lVar17 = lVar17 + -4;
        } while (piVar14 != end._M_current);
      }
LAB_0026e3c0:
      bVar18 = true;
    }
    else {
      uVar6 = uVar8 >> 1;
      pdVar4 = *comp.vals;
      if ((long)uVar8 < 0x81) {
        iVar2 = *begin._M_current;
        iVar3 = begin._M_current[uVar6];
        if ((ABS(pdVar4[iVar3]) < ABS(pdVar4[iVar2])) ||
           ((iVar3 < iVar2 && (ABS(pdVar4[iVar3]) <= ABS(pdVar4[iVar2]))))) {
          begin._M_current[uVar6] = iVar2;
          *begin._M_current = iVar3;
        }
        iVar2 = end._M_current[-1];
        iVar3 = *begin._M_current;
        if ((ABS(pdVar4[iVar3]) < ABS(pdVar4[iVar2])) ||
           ((iVar3 < iVar2 && (ABS(pdVar4[iVar3]) <= ABS(pdVar4[iVar2]))))) {
          *begin._M_current = iVar2;
          end._M_current[-1] = iVar3;
        }
        iVar2 = *begin._M_current;
        iVar3 = begin._M_current[uVar6];
        if ((ABS(pdVar4[iVar3]) < ABS(pdVar4[iVar2])) ||
           ((iVar3 < iVar2 && (ABS(pdVar4[iVar3]) <= ABS(pdVar4[iVar2]))))) {
          begin._M_current[uVar6] = iVar2;
          *begin._M_current = iVar3;
        }
      }
      else {
        iVar2 = begin._M_current[uVar6];
        iVar3 = *begin._M_current;
        if ((ABS(pdVar4[iVar3]) < ABS(pdVar4[iVar2])) ||
           ((iVar3 < iVar2 && (ABS(pdVar4[iVar3]) <= ABS(pdVar4[iVar2]))))) {
          *begin._M_current = iVar2;
          begin._M_current[uVar6] = iVar3;
        }
        iVar2 = end._M_current[-1];
        iVar3 = begin._M_current[uVar6];
        if ((ABS(pdVar4[iVar3]) < ABS(pdVar4[iVar2])) ||
           ((iVar3 < iVar2 && (ABS(pdVar4[iVar3]) <= ABS(pdVar4[iVar2]))))) {
          begin._M_current[uVar6] = iVar2;
          end._M_current[-1] = iVar3;
        }
        iVar2 = begin._M_current[uVar6];
        iVar3 = *begin._M_current;
        if ((ABS(pdVar4[iVar3]) < ABS(pdVar4[iVar2])) ||
           ((iVar3 < iVar2 && (ABS(pdVar4[iVar3]) <= ABS(pdVar4[iVar2]))))) {
          *begin._M_current = iVar2;
          begin._M_current[uVar6] = iVar3;
        }
        iVar2 = begin._M_current[uVar6 - 1];
        iVar3 = begin._M_current[1];
        if ((ABS(pdVar4[iVar3]) < ABS(pdVar4[iVar2])) ||
           ((iVar3 < iVar2 && (ABS(pdVar4[iVar3]) <= ABS(pdVar4[iVar2]))))) {
          begin._M_current[1] = iVar2;
          begin._M_current[uVar6 - 1] = iVar3;
        }
        iVar2 = end._M_current[-2];
        iVar3 = begin._M_current[uVar6 - 1];
        if ((ABS(pdVar4[iVar3]) < ABS(pdVar4[iVar2])) ||
           ((iVar3 < iVar2 && (ABS(pdVar4[iVar3]) <= ABS(pdVar4[iVar2]))))) {
          begin._M_current[uVar6 - 1] = iVar2;
          end._M_current[-2] = iVar3;
        }
        iVar2 = begin._M_current[uVar6 - 1];
        iVar3 = begin._M_current[1];
        if ((ABS(pdVar4[iVar3]) < ABS(pdVar4[iVar2])) ||
           ((iVar3 < iVar2 && (ABS(pdVar4[iVar3]) <= ABS(pdVar4[iVar2]))))) {
          begin._M_current[1] = iVar2;
          begin._M_current[uVar6 - 1] = iVar3;
        }
        iVar2 = begin._M_current[uVar6 + 1];
        iVar3 = begin._M_current[2];
        if ((ABS(pdVar4[iVar3]) < ABS(pdVar4[iVar2])) ||
           ((iVar3 < iVar2 && (ABS(pdVar4[iVar3]) <= ABS(pdVar4[iVar2]))))) {
          begin._M_current[2] = iVar2;
          begin._M_current[uVar6 + 1] = iVar3;
        }
        iVar2 = end._M_current[-3];
        iVar3 = begin._M_current[uVar6 + 1];
        if ((ABS(pdVar4[iVar3]) < ABS(pdVar4[iVar2])) ||
           ((iVar3 < iVar2 && (ABS(pdVar4[iVar3]) <= ABS(pdVar4[iVar2]))))) {
          begin._M_current[uVar6 + 1] = iVar2;
          end._M_current[-3] = iVar3;
        }
        iVar2 = begin._M_current[uVar6 + 1];
        iVar3 = begin._M_current[2];
        if ((ABS(pdVar4[iVar3]) < ABS(pdVar4[iVar2])) ||
           ((iVar3 < iVar2 && (ABS(pdVar4[iVar3]) <= ABS(pdVar4[iVar2]))))) {
          begin._M_current[2] = iVar2;
          begin._M_current[uVar6 + 1] = iVar3;
        }
        iVar2 = begin._M_current[uVar6];
        iVar3 = begin._M_current[uVar6 - 1];
        if ((ABS(pdVar4[iVar3]) < ABS(pdVar4[iVar2])) ||
           ((iVar3 < iVar2 && (ABS(pdVar4[iVar3]) <= ABS(pdVar4[iVar2]))))) {
          begin._M_current[uVar6 - 1] = iVar2;
          begin._M_current[uVar6] = iVar3;
        }
        iVar2 = begin._M_current[uVar6 + 1];
        iVar3 = begin._M_current[uVar6];
        if ((ABS(pdVar4[iVar3]) < ABS(pdVar4[iVar2])) ||
           ((iVar3 < iVar2 && (ABS(pdVar4[iVar3]) <= ABS(pdVar4[iVar2]))))) {
          begin._M_current[uVar6] = iVar2;
          begin._M_current[uVar6 + 1] = iVar3;
        }
        iVar2 = begin._M_current[uVar6];
        iVar3 = begin._M_current[uVar6 - 1];
        if ((ABS(pdVar4[iVar3]) < ABS(pdVar4[iVar2])) ||
           ((iVar3 < iVar2 && (ABS(pdVar4[iVar3]) <= ABS(pdVar4[iVar2]))))) {
          begin._M_current[uVar6 - 1] = iVar2;
          begin._M_current[uVar6] = iVar3;
        }
        iVar2 = *begin._M_current;
        *begin._M_current = begin._M_current[uVar6];
        begin._M_current[uVar6] = iVar2;
      }
      if ((leftmost & 1U) == 0) {
        iVar2 = *begin._M_current;
        pdVar4 = *comp.vals;
        dVar19 = ABS(pdVar4[iVar2]);
        if ((dVar19 < ABS(pdVar4[begin._M_current[-1]])) ||
           ((iVar2 < begin._M_current[-1] && (dVar19 <= ABS(pdVar4[begin._M_current[-1]])))))
        goto LAB_0026de7c;
        lVar17 = 0;
        while( true ) {
          if ((dVar19 <= ABS(pdVar4[*(int *)((long)piVar1 + lVar17)])) &&
             ((iVar2 <= *(int *)((long)piVar1 + lVar17) ||
              (dVar19 < ABS(pdVar4[*(int *)((long)piVar1 + lVar17)]))))) break;
          lVar17 = lVar17 + -4;
        }
        piVar14 = (int *)((long)piVar1 + lVar17);
        piVar10 = begin._M_current + 1;
        if (lVar17 == 0) {
          while (piVar11 = piVar10, piVar16 = piVar11 + -1, piVar11 + -1 < piVar14) {
            piVar16 = piVar11;
            if ((ABS(pdVar4[*piVar11]) < dVar19) ||
               ((piVar10 = piVar11 + 1, *piVar11 < iVar2 && (ABS(pdVar4[*piVar11]) <= dVar19))))
            break;
          }
        }
        else {
          do {
            piVar16 = piVar10;
            if (ABS(pdVar4[*piVar16]) < dVar19) break;
            piVar10 = piVar16 + 1;
          } while ((iVar2 <= *piVar16) || (dVar19 < ABS(pdVar4[*piVar16])));
        }
LAB_0026e432:
        if (piVar16 < piVar14) {
          iVar3 = *piVar16;
          *piVar16 = *piVar14;
          *piVar14 = iVar3;
          do {
            do {
              piVar14 = piVar14 + -1;
            } while (ABS(pdVar4[*piVar14]) < dVar19);
          } while ((*piVar14 < iVar2) && (ABS(pdVar4[*piVar14]) <= dVar19));
          piVar10 = piVar16 + 1;
          do {
            piVar16 = piVar10;
            if (ABS(pdVar4[*piVar16]) < dVar19) break;
            piVar10 = piVar16 + 1;
          } while ((iVar2 <= *piVar16) || (dVar19 < ABS(pdVar4[*piVar16])));
          goto LAB_0026e432;
        }
        *begin._M_current = *piVar14;
        *piVar14 = iVar2;
        bVar18 = false;
        begin._M_current = piVar14 + 1;
      }
      else {
LAB_0026de7c:
        iVar2 = *begin._M_current;
        pdVar4 = *comp.vals;
        dVar19 = ABS(pdVar4[iVar2]);
        lVar9 = 0;
        _Var7._M_current = begin._M_current;
        while( true ) {
          piVar14 = _Var7._M_current + 1;
          if ((ABS(pdVar4[*piVar14]) <= dVar19) &&
             ((*piVar14 <= iVar2 || (ABS(pdVar4[*piVar14]) < dVar19)))) break;
          lVar9 = lVar9 + -4;
          _Var7._M_current = piVar14;
        }
        piVar10 = piVar1;
        if (lVar9 == 0) {
          while (piVar11 = piVar10, piVar16 = piVar11 + 1, piVar14 < piVar11 + 1) {
            piVar16 = piVar11;
            if ((dVar19 < ABS(pdVar4[*piVar11])) ||
               ((piVar10 = piVar11 + -1, iVar2 < *piVar11 && (dVar19 <= ABS(pdVar4[*piVar11])))))
            break;
          }
        }
        else {
          do {
            piVar16 = piVar10;
            if (dVar19 < ABS(pdVar4[*piVar16])) break;
            piVar10 = piVar16 + -1;
          } while ((*piVar16 <= iVar2) || (ABS(pdVar4[*piVar16]) < dVar19));
        }
        piVar10 = piVar14;
        piVar11 = piVar16;
        if (piVar14 < piVar16) {
          do {
            iVar3 = *piVar10;
            *piVar10 = *piVar11;
            *piVar11 = iVar3;
            do {
              do {
                _Var7._M_current = piVar10;
                piVar10 = _Var7._M_current + 1;
              } while (dVar19 < ABS(pdVar4[*piVar10]));
            } while ((iVar2 < *piVar10) && (dVar19 <= ABS(pdVar4[*piVar10])));
            piVar5 = piVar11 + -1;
            do {
              piVar11 = piVar5;
              if (dVar19 < ABS(pdVar4[*piVar11])) break;
              piVar5 = piVar11 + -1;
            } while ((*piVar11 <= iVar2) || (ABS(pdVar4[*piVar11]) < dVar19));
          } while (piVar10 < piVar11);
        }
        *begin._M_current = *_Var7._M_current;
        *_Var7._M_current = iVar2;
        uVar12 = (long)_Var7._M_current - (long)begin._M_current >> 2;
        piVar10 = _Var7._M_current + 1;
        uVar6 = (long)end._M_current - (long)piVar10 >> 2;
        if (((long)uVar12 < (long)(uVar8 >> 3)) || ((long)uVar6 < (long)(uVar8 >> 3))) {
          bad_allowed = bad_allowed + -1;
          if (bad_allowed == 0) {
            lVar9 = (long)((uVar8 - ((long)(uVar8 - 2) >> 0x3f)) + -2) >> 1;
            do {
              std::
              __adjust_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,int,__gnu_cxx::__ops::_Iter_comp_iter<HighsCliqueTable::extractCliquesFromCut(HighsMipSolver_const&,int_const*,double_const*,int,double)::__1>>
                        (begin,lVar9,uVar8,begin._M_current[lVar9],
                         (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:1213:36)>
                          )comp.vals);
              bVar18 = lVar9 != 0;
              lVar9 = lVar9 + -1;
            } while (bVar18);
            bVar18 = true;
            piVar14 = piVar1;
            while (4 < lVar17) {
              iVar2 = *piVar14;
              *piVar14 = *begin._M_current;
              lVar17 = lVar17 + -4;
              std::
              __adjust_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,int,__gnu_cxx::__ops::_Iter_comp_iter<HighsCliqueTable::extractCliquesFromCut(HighsMipSolver_const&,int_const*,double_const*,int,double)::__1>>
                        (begin,0,lVar17 >> 2,iVar2,
                         (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:1213:36)>
                          )comp.vals);
              piVar14 = piVar14 + -1;
            }
            bad_allowed = 0;
            goto LAB_0026e3c3;
          }
          if (0x17 < (long)uVar12) {
            uVar8 = uVar12 & 0xfffffffffffffffc;
            iVar2 = *begin._M_current;
            *begin._M_current = *(begin._M_current + uVar8);
            *(begin._M_current + uVar8) = iVar2;
            iVar2 = _Var7._M_current[-1];
            _Var7._M_current[-1] = *(_Var7._M_current - uVar8);
            *(_Var7._M_current - uVar8) = iVar2;
            if (0x80 < (long)uVar12) {
              uVar12 = uVar12 >> 2;
              iVar2 = begin._M_current[1];
              begin._M_current[1] = begin._M_current[uVar12 + 1];
              begin._M_current[uVar12 + 1] = iVar2;
              iVar2 = begin._M_current[2];
              begin._M_current[2] = begin._M_current[uVar12 + 2];
              begin._M_current[uVar12 + 2] = iVar2;
              iVar2 = _Var7._M_current[-2];
              _Var7._M_current[-2] = _Var7._M_current[~uVar12];
              _Var7._M_current[~uVar12] = iVar2;
              iVar2 = _Var7._M_current[-3];
              _Var7._M_current[-3] = _Var7._M_current[-2 - uVar12];
              _Var7._M_current[-2 - uVar12] = iVar2;
            }
          }
          if (0x17 < (long)uVar6) {
            iVar2 = _Var7._M_current[1];
            uVar8 = uVar6 & 0xfffffffffffffffc;
            _Var7._M_current[1] = *(uVar8 + 4 + _Var7._M_current);
            *(uVar8 + 4 + _Var7._M_current) = iVar2;
            iVar2 = end._M_current[-1];
            end._M_current[-1] = *(end._M_current - uVar8);
            *(end._M_current - uVar8) = iVar2;
            if (0x80 < (long)uVar6) {
              uVar6 = uVar6 >> 2;
              iVar2 = _Var7._M_current[2];
              _Var7._M_current[2] = _Var7._M_current[uVar6 + 2];
              _Var7._M_current[uVar6 + 2] = iVar2;
              iVar2 = _Var7._M_current[3];
              _Var7._M_current[3] = _Var7._M_current[uVar6 + 3];
              _Var7._M_current[uVar6 + 3] = iVar2;
              iVar2 = end._M_current[-2];
              end._M_current[-2] = end._M_current[~uVar6];
              end._M_current[~uVar6] = iVar2;
              iVar2 = end._M_current[-3];
              end._M_current[-3] = end._M_current[-2 - uVar6];
              end._M_current[-2 - uVar6] = iVar2;
            }
          }
        }
        else if (piVar16 <= piVar14) {
          if (begin._M_current == _Var7._M_current) {
LAB_0026e2db:
            if (piVar10 == end._M_current) goto LAB_0026e3c0;
            lVar17 = 4;
            lVar9 = 0;
            uVar8 = 0;
            do {
              piVar14 = _Var7._M_current + lVar17 + 4;
              if (piVar14 == end._M_current) goto LAB_0026e3c0;
              piVar16 = _Var7._M_current + lVar17;
              iVar2 = *piVar14;
              iVar3 = *piVar16;
              dVar19 = ABS(pdVar4[iVar2]);
              if ((ABS(pdVar4[iVar3]) < dVar19) ||
                 ((iVar3 < iVar2 && (ABS(pdVar4[iVar3]) <= dVar19)))) {
                *piVar14 = iVar3;
                lVar15 = lVar9;
                if (lVar17 != 4) {
                  do {
                    iVar3 = *(_Var7._M_current + lVar15);
                    if ((dVar19 <= ABS(pdVar4[iVar3])) &&
                       ((iVar2 <= iVar3 || (dVar19 < ABS(pdVar4[iVar3]))))) break;
                    *(int *)((long)piVar10 + lVar15) = iVar3;
                    lVar15 = lVar15 + -4;
                  } while (lVar15 != 0);
                  piVar16 = (int *)(lVar15 + (long)piVar10);
                }
                *piVar16 = iVar2;
                uVar8 = uVar8 + ((long)piVar14 - (long)piVar16 >> 2);
              }
              lVar17 = lVar17 + 4;
              lVar9 = lVar9 + 4;
            } while (uVar8 < 9);
          }
          else {
            lVar17 = 0;
            uVar8 = 0;
            _Var13._M_current = begin._M_current;
            do {
              piVar14 = _Var13._M_current + 1;
              if (piVar14 == _Var7._M_current) goto LAB_0026e2db;
              iVar2 = _Var13._M_current[1];
              iVar3 = *_Var13._M_current;
              dVar19 = ABS(pdVar4[iVar2]);
              if ((ABS(pdVar4[iVar3]) < dVar19) ||
                 ((iVar3 < iVar2 && (ABS(pdVar4[iVar3]) <= dVar19)))) {
                _Var13._M_current[1] = iVar3;
                if (_Var13._M_current != begin._M_current) {
                  lVar9 = 0;
                  do {
                    iVar3 = *(_Var13._M_current + lVar9 + -4);
                    if ((dVar19 <= ABS(pdVar4[iVar3])) &&
                       ((iVar2 <= iVar3 || (dVar19 < ABS(pdVar4[iVar3]))))) break;
                    *(_Var13._M_current + lVar9) = iVar3;
                    lVar9 = lVar9 + -4;
                  } while (lVar17 != lVar9);
                  _Var13._M_current = _Var13._M_current + lVar9;
                }
                *_Var13._M_current = iVar2;
                uVar8 = uVar8 + ((long)piVar14 - (long)_Var13._M_current >> 2);
              }
              lVar17 = lVar17 + -4;
              _Var13._M_current = piVar14;
            } while (uVar8 < 9);
          }
        }
        pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCliqueTable::extractCliquesFromCut(HighsMipSolver_const&,int_const*,double_const*,int,double)::__1,false>
                  (begin,_Var7,comp,bad_allowed,(bool)(leftmost & 1));
        bVar18 = false;
        leftmost = false;
        begin._M_current = piVar10;
      }
    }
LAB_0026e3c3:
    if (bVar18) {
      return;
    }
  } while( true );
}

Assistant:

inline void pdqsort_loop(Iter begin, Iter end, Compare comp, int bad_allowed, bool leftmost = true) {
        typedef typename std::iterator_traits<Iter>::difference_type diff_t;

        // Use a while loop for tail recursion elimination.
        while (true) {
            diff_t size = end - begin;

            // Insertion sort is faster for small arrays.
            if (size < insertion_sort_threshold) {
                if (leftmost) insertion_sort(begin, end, comp);
                else unguarded_insertion_sort(begin, end, comp);
                return;
            }

            // Choose pivot as median of 3 or pseudomedian of 9.
            diff_t s2 = size / 2;
            if (size > ninther_threshold) {
                sort3(begin, begin + s2, end - 1, comp);
                sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
                sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
                sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
                std::iter_swap(begin, begin + s2);
            } else sort3(begin + s2, begin, end - 1, comp);

            // If *(begin - 1) is the end of the right partition of a previous partition operation
            // there is no element in [begin, end) that is smaller than *(begin - 1). Then if our
            // pivot compares equal to *(begin - 1) we change strategy, putting equal elements in
            // the left partition, greater elements in the right partition. We do not have to
            // recurse on the left partition, since it's sorted (all equal).
            if (!leftmost && !comp(*(begin - 1), *begin)) {
                begin = partition_left(begin, end, comp) + 1;
                continue;
            }

            // Partition and get results.
            std::pair<Iter, bool> part_result =
                Branchless ? partition_right_branchless(begin, end, comp)
                           : partition_right(begin, end, comp);
            Iter pivot_pos = part_result.first;
            bool already_partitioned = part_result.second;

            // Check for a highly unbalanced partition.
            diff_t l_size = pivot_pos - begin;
            diff_t r_size = end - (pivot_pos + 1);
            bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

            // If we got a highly unbalanced partition we shuffle elements to break many patterns.
            if (highly_unbalanced) {
                // If we had too many bad partitions, switch to heapsort to guarantee O(n log n).
                if (--bad_allowed == 0) {
                    std::make_heap(begin, end, comp);
                    std::sort_heap(begin, end, comp);
                    return;
                }

                if (l_size >= insertion_sort_threshold) {
                    std::iter_swap(begin,             begin + l_size / 4);
                    std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);

                    if (l_size > ninther_threshold) {
                        std::iter_swap(begin + 1,         begin + (l_size / 4 + 1));
                        std::iter_swap(begin + 2,         begin + (l_size / 4 + 2));
                        std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
                        std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
                    }
                }
                
                if (r_size >= insertion_sort_threshold) {
                    std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
                    std::iter_swap(end - 1,                   end - r_size / 4);
                    
                    if (r_size > ninther_threshold) {
                        std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
                        std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
                        std::iter_swap(end - 2,             end - (1 + r_size / 4));
                        std::iter_swap(end - 3,             end - (2 + r_size / 4));
                    }
                }
            } else {
                // If we were decently balanced and we tried to sort an already partitioned
                // sequence try to use insertion sort.
                if (already_partitioned && partial_insertion_sort(begin, pivot_pos, comp)
                                        && partial_insertion_sort(pivot_pos + 1, end, comp)) return;
            }
                
            // Sort the left partition first using recursion and do tail recursion elimination for
            // the right-hand partition.
            pdqsort_loop<Iter, Compare, Branchless>(begin, pivot_pos, comp, bad_allowed, leftmost);
            begin = pivot_pos + 1;
            leftmost = false;
        }
    }